

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_codePointRange(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint c;
  uint uVar6;
  JSValue JVar7;
  uint local_48;
  uint local_44;
  StringBuffer b_s;
  int64_t iVar5;
  
  iVar1 = JS_ToInt32(ctx,(int32_t *)&local_44,*argv);
  iVar5 = 6;
  if (iVar1 == 0) {
    iVar1 = JS_ToInt32(ctx,(int32_t *)&local_48,argv[1]);
    if (iVar1 == 0) {
      uVar6 = 0x110000;
      if (local_48 < 0x110000) {
        uVar6 = local_48;
      }
      c = local_44;
      if (uVar6 <= local_44) {
        c = uVar6;
      }
      iVar1 = uVar6 - c;
      if (0x10000 < local_48) {
        uVar3 = 0x10000;
        if (0x10000 < c) {
          uVar3 = c;
        }
        iVar1 = iVar1 + (uVar6 - uVar3);
      }
      iVar1 = string_buffer_init2(ctx,&b_s,iVar1,(uint)(0xff < local_48));
      if (iVar1 == 0) {
        for (; c < uVar6; c = c + 1) {
          string_buffer_putc(&b_s,c);
        }
        JVar7 = string_buffer_end(&b_s);
        iVar5 = JVar7.tag;
        uVar4 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
        uVar2 = (ulong)JVar7.u._0_4_;
        goto LAB_00127eb2;
      }
    }
  }
  uVar2 = 0;
  uVar4 = 0;
LAB_00127eb2:
  JVar7.u.ptr = (void *)(uVar2 | uVar4);
  JVar7.tag = iVar5;
  return JVar7;
}

Assistant:

JSValue js_string_codePointRange(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    uint32_t start, end, i, n;
    StringBuffer b_s, *b = &b_s;

    if (JS_ToUint32(ctx, &start, argv[0]) ||
        JS_ToUint32(ctx, &end, argv[1]))
        return JS_EXCEPTION;
    end = min_uint32(end, 0x10ffff + 1);

    if (start > end) {
        start = end;
    }
    n = end - start;
    if (end > 0x10000) {
        n += end - max_uint32(start, 0x10000);
    }
    if (string_buffer_init2(ctx, b, n, end >= 0x100))
        return JS_EXCEPTION;
    for(i = start; i < end; i++) {
        string_buffer_putc(b, i);
    }
    return string_buffer_end(b);
}